

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

MemberSyntax * __thiscall slang::parsing::Parser::parseClockingItem(Parser *this)

{
  SyntaxFactory *this_00;
  bool bVar1;
  int iVar2;
  SourceLocation SVar3;
  ClockingSkewSyntax *inputSkew;
  ClockingSkewSyntax *outputSkew;
  ClockingDirectionSyntax *direction;
  ClockingItemSyntax *pCVar4;
  MemberSyntax *pMVar5;
  AttributeSpecSyntax *pAVar6;
  undefined8 extraout_RAX;
  undefined4 extraout_var;
  uint uVar7;
  Info *extraout_RDX;
  Token TVar8;
  string_view sVar9;
  Token semi;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> decls;
  Token local_158;
  Token local_148;
  Token local_138;
  Token local_128;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_118;
  uint local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  Token local_e8;
  SyntaxKind local_d8;
  pointer local_c8;
  Token local_b8;
  undefined1 local_a8 [24];
  undefined1 local_90 [16];
  size_type local_80;
  
  Token::Token(&local_148);
  TVar8 = ParserBase::peek(&this->super_ParserBase);
  uVar7 = TVar8.kind - 0xc2;
  if ((0x26 < uVar7) || ((0x4000000003U >> ((ulong)uVar7 & 0x3f) & 1) == 0)) {
    if (TVar8.kind != DefaultKeyword) {
      pMVar5 = parseSingleMember(this,ClockingItem);
      return pMVar5;
    }
    local_148 = ParserBase::consume(&this->super_ParserBase);
  }
  Token::Token(&local_158);
  Token::Token(&local_138);
  bVar1 = ParserBase::peek(&this->super_ParserBase,InOutKeyword);
  if (bVar1) {
    local_158 = ParserBase::consume(&this->super_ParserBase);
    if (local_148.info != (Info *)0x0) {
      SVar3 = Token::location(&local_158);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4d0005,SVar3);
    }
    outputSkew = (ClockingSkewSyntax *)0x0;
    inputSkew = (ClockingSkewSyntax *)0x0;
    goto LAB_00332383;
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,InputKeyword);
  if (bVar1) {
    local_158 = ParserBase::consume(&this->super_ParserBase);
    inputSkew = parseClockingSkew(this);
    if ((inputSkew == (ClockingSkewSyntax *)0x0) && (local_148.info != (Info *)0x0)) {
      SVar3 = Token::location(&local_158);
      sVar9 = Token::rawText(&local_158);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x230005,
                          (SourceLocation)((long)SVar3 + sVar9._M_len * 0x10000000));
      goto LAB_003322cc;
    }
  }
  else {
LAB_003322cc:
    inputSkew = (ClockingSkewSyntax *)0x0;
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,OutputKeyword);
  if (bVar1) {
    local_138 = ParserBase::consume(&this->super_ParserBase);
    outputSkew = parseClockingSkew(this);
    if ((outputSkew == (ClockingSkewSyntax *)0x0) && (local_148.info != (Info *)0x0)) {
      SVar3 = Token::location(&local_138);
      sVar9 = Token::rawText(&local_138);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x230005,
                          (SourceLocation)((long)SVar3 + sVar9._M_len * 0x10000000));
      goto LAB_00332339;
    }
  }
  else {
LAB_00332339:
    outputSkew = (ClockingSkewSyntax *)0x0;
  }
  if (((local_148.info != (Info *)0x0) && (local_158.info == (Info *)0x0)) &&
     (local_138.info == (Info *)0x0)) {
    SVar3 = Token::location(&local_148);
    sVar9 = Token::valueText(&local_148);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x230005,
                        (SourceLocation)((long)SVar3 + sVar9._M_len * 0x10000000));
  }
LAB_00332383:
  this_00 = &this->factory;
  direction = slang::syntax::SyntaxFactory::clockingDirection
                        (this_00,local_158,inputSkew,local_138,outputSkew);
  TVar8 = local_148;
  if (local_148.info == (Info *)0x0) {
    Token::Token(&local_128);
    local_a8._8_8_ = (SyntaxNode *)0x0;
    local_a8._16_8_ = 4;
    local_a8._0_8_ = (pointer)local_90;
    local_e8 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isSemicolon(local_e8.kind);
    if (bVar1) {
      SVar3 = Token::location(&local_e8);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x310005,SVar3);
      TVar8 = ParserBase::expect(&this->super_ParserBase,Semicolon);
      local_128 = TVar8;
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isIdentifierOrComma(local_e8.kind);
      if (bVar1) {
        do {
          local_e8 = ParserBase::peek(&this->super_ParserBase);
          pAVar6 = parseAttributeSpec(this);
          local_118._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pAVar6;
          local_108 = CONCAT31(local_108._1_3_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_a8,
                     (TokenOrSyntax *)&local_118._M_first);
          TVar8 = ParserBase::peek(&this->super_ParserBase);
          bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar8.kind);
          if ((bVar1) || (bVar1 = ParserBase::peek(&this->super_ParserBase,Comma), !bVar1)) break;
          local_118._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_108 = local_108 & 0xffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_a8,
                     (TokenOrSyntax *)&local_118._M_first);
          TVar8 = ParserBase::peek(&this->super_ParserBase);
          bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar8.kind);
          if (bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            break;
          }
          TVar8 = ParserBase::peek(&this->super_ParserBase);
        } while (((local_e8.kind != TVar8.kind) ||
                 ((SyntaxNode *)local_e8.info != (SyntaxNode *)TVar8.info)) ||
                (bVar1 = ParserBase::
                         skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                                   (&this->super_ParserBase,(DiagCode)0x310005,true), bVar1));
        TVar8 = ParserBase::expect(&this->super_ParserBase,Semicolon);
        local_128 = TVar8;
      }
      else {
        ParserBase::reportMissingList
                  (&this->super_ParserBase,local_e8,Semicolon,&local_128,(DiagCode)0x310005);
        TVar8.info = extraout_RDX;
        TVar8.kind = (short)extraout_RAX;
        TVar8._2_1_ = (char)((ulong)extraout_RAX >> 0x10);
        TVar8.numFlags.raw = (char)((ulong)extraout_RAX >> 0x18);
        TVar8.rawLen = (int)((ulong)extraout_RAX >> 0x20);
      }
    }
    local_108 = 1;
    local_100 = 0;
    uStack_f8 = 0;
    local_f0 = 0;
    local_118 = (_Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>)
                ZEXT816(0x4ea348);
    iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_a8,
                       (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)TVar8.info);
    local_c8 = (pointer)CONCAT44(extraout_var,iVar2);
    local_d8 = SeparatedList;
    local_e8 = (Token)ZEXT816(0x4ecdf0);
    pCVar4 = slang::syntax::SyntaxFactory::clockingItem
                       (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                                &local_118._M_first,direction,
                        (SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *)&local_e8,
                        local_128);
    if ((pointer)local_a8._0_8_ != (pointer)local_90) {
      free((void *)local_a8._0_8_);
    }
  }
  else {
    local_a8._8_8_ = (SyntaxNode *)0x0;
    local_a8._16_4_ = SyntaxList;
    local_90._0_8_ = (_func_int *)0x0;
    local_90._8_8_ = (pointer)0x0;
    local_80 = 0;
    local_a8._0_8_ = &PTR_getChild_004ea348;
    local_b8 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    pCVar4 = (ClockingItemSyntax *)
             slang::syntax::SyntaxFactory::defaultSkewItem
                       (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_a8,TVar8
                        ,direction,local_b8);
  }
  return &pCVar4->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseClockingItem() {
    Token def;
    switch (peek().kind) {
        case TokenKind::DefaultKeyword:
            def = consume();
            break;
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
            break;
        default:
            return parseSingleMember(SyntaxKind::ClockingItem);
    }

    Token input, output;
    ClockingSkewSyntax* inputSkew = nullptr;
    ClockingSkewSyntax* outputSkew = nullptr;
    if (peek(TokenKind::InOutKeyword)) {
        input = consume();
        if (def)
            addDiag(diag::InOutDefaultSkew, input.location());
    }
    else {
        if (peek(TokenKind::InputKeyword)) {
            input = consume();
            inputSkew = parseClockingSkew();
            if (def && !inputSkew)
                addDiag(diag::ExpectedClockingSkew, input.location() + input.rawText().length());
        }

        if (peek(TokenKind::OutputKeyword)) {
            output = consume();
            outputSkew = parseClockingSkew();
            if (def && !outputSkew)
                addDiag(diag::ExpectedClockingSkew, output.location() + output.rawText().length());
        }

        if (def && !input && !output)
            addDiag(diag::ExpectedClockingSkew, def.location() + def.valueText().length());
    }

    auto& direction = factory.clockingDirection(input, inputSkew, output, outputSkew);
    if (def)
        return &factory.defaultSkewItem(nullptr, def, direction, expect(TokenKind::Semicolon));

    Token semi;
    SmallVector<TokenOrSyntax, 4> decls;
    parseList<isIdentifierOrComma, isSemicolon>(decls, TokenKind::Semicolon, TokenKind::Comma, semi,
                                                RequireItems::True, diag::ExpectedIdentifier,
                                                [this] { return &parseAttributeSpec(); });

    return &factory.clockingItem(nullptr, direction, decls.copy(alloc), semi);
}